

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::fromPow2Digits
                (bitwidth_t bits,bool isSigned,bool anyUnknown,uint32_t radix,uint32_t shift,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  bool bVar1;
  uint32_t uVar2;
  reference peVar3;
  invalid_argument *this;
  size_type sVar4;
  uint *puVar5;
  byte in_CL;
  uint uVar6;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  bitwidth_t in_ESI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  uint in_R8D;
  int in_R9D;
  SVInt SVar8;
  uint32_t topWord;
  uint64_t mask;
  uint32_t wordOffset;
  uint32_t wordBits;
  uint32_t givenBits;
  uint64_t value;
  uint64_t unknown;
  logic_t d;
  ptrdiff_t i;
  uint32_t bitPos;
  uint64_t *endPtr;
  uint64_t *dest;
  uint64_t unknownWord;
  uint64_t word;
  uint32_t ones;
  uint32_t numWords;
  SVInt *result;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  undefined4 in_stack_fffffffffffffe84;
  ulong local_178;
  uint local_170;
  sbyte local_16c;
  bitwidth_t local_168;
  uint local_164;
  uint local_160;
  undefined1 local_159;
  char *local_158;
  undefined8 local_150;
  string local_148 [36];
  undefined1 local_124;
  uint8_t local_123;
  undefined1 local_122;
  uint8_t local_121;
  ulong local_120;
  ulong local_118;
  logic_t local_109;
  size_type local_108;
  uint local_fc;
  ulong *local_f8;
  ulong *local_f0;
  ulong local_e8;
  ulong local_e0;
  uint local_d8;
  uint32_t local_c8;
  undefined1 local_c1;
  int local_c0;
  uint local_bc;
  byte local_b6;
  byte local_b5;
  bitwidth_t local_b4;
  ulong local_a8 [2];
  undefined1 local_98 [16];
  undefined8 local_88;
  ulong *local_80;
  char *local_78;
  undefined8 local_70;
  uint *local_68;
  ulong *local_60;
  char *local_58;
  undefined8 local_50;
  string *local_48;
  undefined1 *local_38;
  ulong local_30;
  ulong *local_28;
  ulong *local_20;
  undefined8 *local_18;
  ulong local_10;
  ulong *local_8;
  
  local_b5 = in_DL & 1;
  local_b6 = in_CL & 1;
  local_c1 = 0;
  this_00 = in_RDI;
  local_c0 = in_R9D;
  local_bc = in_R8D;
  local_b4 = in_ESI;
  allocZeroed((bitwidth_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
              SUB81((ulong)in_RDI >> 0x10,0));
  uVar2 = getNumWords(local_b4,false);
  local_d8 = (1 << ((byte)local_c0 & 0x1f)) - 1;
  local_e0 = 0;
  local_e8 = 0;
  local_f0 = (ulong *)*in_RDI.pVal;
  local_f8 = local_f0 + uVar2;
  local_fc = 0;
  local_c8 = uVar2;
  local_108 = std::span<const_slang::logic_t,_18446744073709551615UL>::size
                        ((span<const_slang::logic_t,_18446744073709551615UL> *)0x34eb05);
  while (local_108 = local_108 - 1, -1 < (long)local_108) {
    peVar3 = std::span<const_slang::logic_t,_18446744073709551615UL>::operator[]
                       ((span<const_slang::logic_t,_18446744073709551615UL> *)&stack0x00000008,
                        local_108);
    local_121 = peVar3->value;
    local_118 = 0;
    local_120 = (ulong)local_121;
    local_122 = 0x80;
    local_109.value = local_121;
    bVar1 = exactlyEqual((logic_t)local_121,(logic_t)0x80);
    if (bVar1) {
      local_120 = 0;
      local_118 = (ulong)local_d8;
    }
    else {
      local_123 = local_109.value;
      local_124 = 0x40;
      bVar1 = exactlyEqual(local_109,(logic_t)0x40);
      if (bVar1) {
        local_120 = (ulong)local_d8;
        local_118 = (ulong)local_d8;
      }
      else if (local_bc <= local_120) {
        local_159 = 1;
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_158 = "Digit {} too large for radix {}";
        local_150 = 0x1f;
        local_48 = local_148;
        local_58 = "Digit {} too large for radix {}";
        local_50 = 0x1f;
        local_60 = &local_120;
        local_68 = &local_bc;
        local_78 = "Digit {} too large for radix {}";
        local_70 = 0x1f;
        local_30 = local_120;
        local_28 = local_a8;
        local_a8[0] = local_120;
        local_38 = local_98;
        local_18 = &local_88;
        local_20 = local_a8;
        local_88 = 0x24;
        local_10 = local_30;
        local_8 = local_28;
        local_80 = local_20;
        ::fmt::v11::vformat_abi_cxx11_(_endPtr,(format_args)_i);
        std::invalid_argument::invalid_argument(this,local_148);
        local_159 = 0;
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
    local_e0 = local_120 << ((byte)local_fc & 0x3f) | local_e0;
    local_e8 = local_118 << ((byte)local_fc & 0x3f) | local_e8;
    local_fc = local_c0 + local_fc;
    if (0x3f < local_fc) {
      *local_f0 = local_e0;
      if ((local_b6 & 1) != 0) {
        local_f0[local_c8] = local_e8;
      }
      local_f0 = local_f0 + 1;
      if (local_f0 == local_f8) break;
      local_fc = local_fc - 0x40;
      local_e0 = local_120 >> ((char)local_c0 - (char)local_fc & 0x3fU);
      local_e8 = local_118 >> ((char)local_c0 - (char)local_fc & 0x3fU);
    }
  }
  if (local_f0 != local_f8) {
    if (local_e0 != 0) {
      *local_f0 = local_e0;
    }
    if (((local_b6 & 1) != 0) && (local_e8 != 0)) {
      local_f0[local_c8] = local_e8;
    }
  }
  clearUnusedBits((SVInt *)CONCAT44(in_stack_fffffffffffffe84,uVar2));
  checkUnknown((SVInt *)this_00.pVal);
  bVar1 = hasUnknown((SVInt *)in_RDI.pVal);
  uVar7 = extraout_RDX;
  if (bVar1) {
    sVar4 = std::span<const_slang::logic_t,_18446744073709551615UL>::size
                      ((span<const_slang::logic_t,_18446744073709551615UL> *)0x34f01f);
    local_164 = (int)sVar4 * local_c0;
    local_168 = getBitWidth((SVInt *)in_RDI.pVal);
    puVar5 = std::min<unsigned_int>(&local_164,&local_168);
    local_160 = *puVar5;
    local_16c = (sbyte)(local_160 & 0x3f);
    local_170 = local_160 >> 6;
    if ((local_160 & 0x3f) == 0) {
      local_16c = 0;
      local_170 = local_170 - 1;
      local_178 = 0;
    }
    else {
      local_178 = -1L << local_16c;
    }
    uVar6 = local_c8 + local_170;
    uVar7 = extraout_RDX_00;
    if (*(ulong *)(*in_RDI.pVal + (ulong)uVar6 * 8) >> (local_16c - 1U & 0x3f) != 0) {
      *(ulong *)(*in_RDI.pVal + (ulong)uVar6 * 8) =
           local_178 | *(ulong *)(*in_RDI.pVal + (ulong)uVar6 * 8);
      while (uVar6 = uVar6 + 1, uVar6 < local_c8 << 1) {
        *(undefined8 *)(*in_RDI.pVal + (ulong)uVar6 * 8) = 0xffffffffffffffff;
      }
      if (*(ulong *)(*in_RDI.pVal + (ulong)local_170 * 8) >> (local_16c - 1U & 0x3f) != 0) {
        *(ulong *)(*in_RDI.pVal + (ulong)local_170 * 8) =
             local_178 | *(ulong *)(*in_RDI.pVal + (ulong)local_170 * 8);
        while (local_170 = local_170 + 1, local_170 < local_c8) {
          *(undefined8 *)(*in_RDI.pVal + (ulong)local_170 * 8) = 0xffffffffffffffff;
        }
      }
      clearUnusedBits((SVInt *)CONCAT44(uVar6,uVar2));
      uVar7 = extraout_RDX_01;
    }
  }
  SVar8.super_SVIntStorage.bitWidth = (int)uVar7;
  SVar8.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar7 >> 0x20);
  SVar8.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar7 >> 0x28);
  SVar8.super_SVIntStorage._14_2_ = (short)((ulong)uVar7 >> 0x30);
  SVar8.super_SVIntStorage.field_0.val = this_00.val;
  return (SVInt)SVar8.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromPow2Digits(bitwidth_t bits, bool isSigned, bool anyUnknown, uint32_t radix,
                            uint32_t shift, std::span<logic_t const> digits) {

    SVInt result = allocZeroed(bits, isSigned, anyUnknown);

    uint32_t numWords = getNumWords(bits, false);
    uint32_t ones = (1 << shift) - 1;
    uint64_t word = 0;
    uint64_t unknownWord = 0;
    uint64_t* dest = result.pVal;
    uint64_t* endPtr = dest + numWords;
    uint32_t bitPos = 0;

    for (ptrdiff_t i = ptrdiff_t(digits.size()) - 1; i >= 0; i--) {
        logic_t d = digits[size_t(i)];
        uint64_t unknown = 0;
        uint64_t value = d.value;

        if (exactlyEqual(d, logic_t::x)) {
            value = 0;
            unknown = ones;
        }
        else if (exactlyEqual(d, logic_t::z)) {
            value = ones;
            unknown = ones;
        }
        else if (value >= radix) {
            SLANG_THROW(std::invalid_argument(
                fmt::format("Digit {} too large for radix {}", value, radix)));
        }

        word |= value << bitPos;
        unknownWord |= unknown << bitPos;
        bitPos += shift;

        if (bitPos >= BITS_PER_WORD) {
            *dest = word;
            if (anyUnknown)
                *(dest + numWords) = unknownWord;

            dest++;
            if (dest == endPtr)
                break;

            bitPos -= BITS_PER_WORD;
            word = value >> (shift - bitPos);
            unknownWord = unknown >> (shift - bitPos);
        }
    }

    if (dest != endPtr) {
        if (word)
            *dest = word;
        if (anyUnknown && unknownWord)
            *(dest + numWords) = unknownWord;
    }

    result.clearUnusedBits();
    result.checkUnknown();

    if (result.hasUnknown()) {
        // If the most significant bit is X or Z, we need to extend that out to the full range.
        uint32_t givenBits = std::min((uint32_t)digits.size() * shift, result.getBitWidth());
        uint32_t wordBits = givenBits % BITS_PER_WORD;
        uint32_t wordOffset = givenBits / BITS_PER_WORD;
        uint64_t mask = UINT64_MAX;
        if (wordBits)
            mask <<= wordBits;
        else {
            wordBits = 64;
            wordOffset--;
            mask = 0;
        }

        uint32_t topWord = numWords + wordOffset;
        if (result.pVal[topWord] >> (wordBits - 1)) {
            // Unknown bit was set, so now do the extension.
            result.pVal[topWord] |= mask;
            for (topWord++; topWord < numWords * 2; topWord++)
                result.pVal[topWord] = UINT64_MAX;

            if (result.pVal[wordOffset] >> (wordBits - 1)) {
                // The Z bit was set as well, so handle that too.
                result.pVal[wordOffset] |= mask;
                for (wordOffset++; wordOffset < numWords; wordOffset++)
                    result.pVal[wordOffset] = UINT64_MAX;
            }
            result.clearUnusedBits();
        }
    }

    return result;
}